

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_test_fixture.cpp
# Opt level: O2

void __thiscall
wallet::InitWalletDirTestingSetup::SetWalletDir
          (InitWalletDirTestingSetup *this,path *walletdir_path)

{
  long in_FS_OFFSET;
  allocator<char> local_59;
  string local_58;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"-walletdir",&local_59);
  std::filesystem::__cxx11::path::string(&local_58,&walletdir_path->super_path);
  ArgsManager::ForceSetArg(&(this->super_BasicTestingSetup).m_args,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InitWalletDirTestingSetup::SetWalletDir(const fs::path& walletdir_path)
{
    m_args.ForceSetArg("-walletdir", fs::PathToString(walletdir_path));
}